

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

void __thiscall QPlainTextEditSearchWidget::doReplaceAll(QPlainTextEditSearchWidget *this)

{
  bool bVar1;
  ulong uVar2;
  bool local_19;
  QPlainTextEditSearchWidget *this_local;
  
  uVar2 = QPlainTextEdit::isReadOnly();
  if ((uVar2 & 1) == 0) {
    QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),KeepAnchor);
    do {
      bVar1 = doSearch(this,true,false,true);
      local_19 = false;
      if (bVar1) {
        local_19 = doReplace(this,true);
      }
    } while (local_19 != false);
  }
  return;
}

Assistant:

void QPlainTextEditSearchWidget::doReplaceAll() {
    if (_textEdit->isReadOnly()) {
        return;
    }

    // start at the top
    _textEdit->moveCursor(QTextCursor::Start);

    // replace until everything to the bottom is replaced
    while (doSearch(true, false) && doReplace(true)) {
    }
}